

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

void __thiscall GlobOpt::OptimizeChecks(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Opnd *this_00;
  Opnd *this_01;
  int64 iVar5;
  undefined4 *puVar6;
  int64 iVar7;
  uint32 mask;
  uint32 cmpValue;
  int64 val_3;
  bool isNegOne;
  int64 val_2;
  bool isMintInt;
  int64 val_1;
  int checksLeft;
  int64 val;
  Opnd *src2;
  Opnd *src1;
  Instr *instr_local;
  GlobOpt *this_local;
  
  this_00 = IR::Instr::GetSrc1(instr);
  this_01 = IR::Instr::GetSrc2(instr);
  OVar1 = instr->m_opcode;
  if (OVar1 == TrapIfMinIntOverNegOne) {
    val_1._4_4_ = 2;
    if ((this_00 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsImmediateOpnd(this_00), bVar3)) {
      iVar5 = IR::Opnd::GetImmediateValue(this_00,this->func);
      iVar4 = IR::Opnd::GetSize(this_00);
      if (iVar4 == 8) {
        bVar3 = iVar5 == -0x8000000000000000;
      }
      else {
        bVar3 = (int)iVar5 == -0x80000000;
      }
      if (bVar3) {
        val_1._4_4_ = 1;
      }
      else {
        instr->m_opcode = Ld_I4;
      }
    }
    if ((this_01 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsImmediateOpnd(this_01), bVar3)) {
      iVar5 = IR::Opnd::GetImmediateValue(this_01,this->func);
      iVar4 = IR::Opnd::GetSize(this_01);
      if (iVar4 == 8) {
        bVar3 = iVar5 == -1;
      }
      else {
        bVar3 = (int)iVar5 == -1;
      }
      if (bVar3) {
        val_1._4_4_ = val_1._4_4_ + -1;
      }
      else {
        instr->m_opcode = Ld_I4;
      }
    }
    if (val_1._4_4_ == 0) {
      TransformIntoUnreachable(-0x7ff5fffa,instr);
      IR::Instr::FreeSrc2(instr);
      InsertByteCodeUses(this,instr,false);
      RemoveCodeAfterNoFallthroughInstr(this,instr);
    }
    else if (instr->m_opcode == Ld_I4) {
      IR::Instr::FreeSrc2(instr);
    }
  }
  else if (OVar1 == TrapIfZero) {
    if ((this_00 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsImmediateOpnd(this_00), bVar3)) {
      iVar5 = IR::Opnd::GetImmediateValue(this_00,this->func);
      if (iVar5 == 0) {
        TransformIntoUnreachable(-0x7ff5e49e,instr);
        InsertByteCodeUses(this,instr,false);
        RemoveCodeAfterNoFallthroughInstr(this,instr);
      }
      else {
        instr->m_opcode = Ld_I4;
      }
    }
  }
  else if (((OVar1 == TrapIfUnalignedAccess) && (this_00 != (Opnd *)0x0)) &&
          (bVar3 = IR::Opnd::IsImmediateOpnd(this_00), bVar3)) {
    iVar5 = IR::Opnd::GetImmediateValue(this_00,this->func);
    bVar3 = IR::Opnd::IsImmediateOpnd(this_01);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x1bb,"(src2->IsImmediateOpnd())","src2->IsImmediateOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    iVar7 = IR::Opnd::GetImmediateValue(this_01,this->func);
    iVar4 = IR::Opnd::GetSize(this_01);
    if (((uint)iVar7 & (iVar4 - 1U ^ 0xffffffff)) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x1be,"((cmpValue & ~mask) == 0)","(cmpValue & ~mask) == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (((uint)iVar5 & iVar4 - 1U) == (uint)iVar7) {
      IR::Instr::FreeSrc2(instr);
      instr->m_opcode = Ld_I4;
    }
    else {
      TransformIntoUnreachable(-0x7ff5e489,instr);
      InsertByteCodeUses(this,instr,false);
      RemoveCodeAfterNoFallthroughInstr(this,instr);
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptimizeChecks(IR::Instr * const instr)
{
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();

    switch (instr->m_opcode)
    {
    case Js::OpCode::TrapIfZero:
        if (src1 && src1->IsImmediateOpnd())
        {
            int64 val = src1->GetImmediateValue(func);
            if (val != 0)
            {
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                TransformIntoUnreachable(WASMERR_DivideByZero, instr);
                InsertByteCodeUses(instr);
                RemoveCodeAfterNoFallthroughInstr(instr); //remove dead code
            }
        }
        break;
    case Js::OpCode::TrapIfMinIntOverNegOne:
    {
        int checksLeft = 2;
        if (src1 && src1->IsImmediateOpnd())
        {
            int64 val = src1->GetImmediateValue(func);
            bool isMintInt = src1->GetSize() == 8 ? val == LONGLONG_MIN : (int32)val == INT_MIN;
            if (!isMintInt)
            {
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                checksLeft--;
            }
        }
        if (src2 && src2->IsImmediateOpnd())
        {
            int64 val = src2->GetImmediateValue(func);
            bool isNegOne = src2->GetSize() == 8 ? val == -1 : (int32)val == -1;
            if (!isNegOne)
            {
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                checksLeft--;
            }
        }

        if (!checksLeft)
        {
            TransformIntoUnreachable(VBSERR_Overflow, instr);
            instr->FreeSrc2();
            InsertByteCodeUses(instr);
            RemoveCodeAfterNoFallthroughInstr(instr); //remove dead code
        }
        else if (instr->m_opcode == Js::OpCode::Ld_I4)
        {
            instr->FreeSrc2();
        }
        break;
    }
    case Js::OpCode::TrapIfUnalignedAccess:
        if (src1 && src1->IsImmediateOpnd())
        {
            int64 val = src1->GetImmediateValue(func);
            Assert(src2->IsImmediateOpnd());
            uint32 cmpValue = (uint32)src2->GetImmediateValue(func);
            uint32 mask = src2->GetSize() - 1;
            Assert((cmpValue & ~mask) == 0);

            if (((uint32)val & mask) == cmpValue)
            {
                instr->FreeSrc2();
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                TransformIntoUnreachable(WASMERR_UnalignedAtomicAccess, instr);
                InsertByteCodeUses(instr);
                RemoveCodeAfterNoFallthroughInstr(instr); //remove dead code
            }
        }
        break;
    default:
        return;
    }
}